

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<MakefileGenerator::SubTarget_*>::relocate
          (QArrayDataPointer<MakefileGenerator::SubTarget_*> *this,qsizetype offset,
          SubTarget ***data)

{
  SubTarget **d_first;
  SubTarget **ppSVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<MakefileGenerator::SubTarget*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (SubTarget ***)0x0) {
    ppSVar1 = *data;
    if ((this->ptr <= ppSVar1) && (ppSVar1 < this->ptr + this->size)) {
      *data = ppSVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }